

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ImportSimpleModuleType(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,uint i)

{
  ModuleData *pMVar1;
  ByteCode *code;
  IntrusiveList<TypeHandle> arguments_00;
  int iVar2;
  char *symbols;
  ExternTypeInfo *pEVar3;
  ExternMemberInfo *pEVar4;
  SynIdentifier *baseName;
  size_t sVar5;
  TypeGenericAlias *pTVar6;
  TypeRef *pTVar7;
  TypeBase *pTVar8;
  undefined4 extraout_var_00;
  TypeFunction *pTVar9;
  TypeBase **ppTVar10;
  TypeUnsizedArray *pTVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  ExternTypeInfo *type;
  bool bVar15;
  IntrusiveList<TypeHandle> arguments;
  IntrusiveList<TypeHandle> local_48;
  TypeBase *local_38;
  TypeHandle *node;
  undefined4 extraout_var;
  
  pMVar1 = moduleCtx->data;
  code = pMVar1->bytecode;
  symbols = FindSymbols(code);
  pEVar3 = FindFirstType(code);
  pEVar4 = FindFirstMember(code);
  if (CAT_FUNCTION < pEVar3[i].subCat) {
    __assert_fail("!\"unexpected type category\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x3069,
                  "void ImportSimpleModuleType(ExpressionContext &, SynBase *, ModuleContext &, unsigned int)"
                 );
  }
  type = pEVar3 + i;
  switch(pEVar3[i].subCat) {
  case CAT_NONE:
    uVar13 = type->offsetToName;
    iVar2 = strcmp(symbols + uVar13,"generic");
    if (iVar2 == 0) {
      if ((moduleCtx->types).count <= i) goto LAB_0017493f;
      pTVar7 = (TypeRef *)ctx->typeGeneric;
      goto LAB_00174865;
    }
    if (symbols[uVar13] != '@') {
      pTVar8 = CheckPreviousTypeDefinition(ctx,source,moduleCtx,symbols,type,(TypeClass **)0x0);
      if (pTVar8 == (TypeBase *)0x0) {
        pcVar12 = (moduleCtx->data->name).begin;
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: new type in module %.*s named %s unsupported",
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar12),pcVar12,
                   symbols + type->offsetToName);
      }
      if (i < (moduleCtx->types).count) {
        (moduleCtx->types).data[i] = pTVar8;
        return;
      }
LAB_0017493f:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<TypeBase *, 32>::operator[](unsigned int) [T = TypeBase *, N = 32]"
                   );
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    baseName = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
    uVar13 = type->offsetToName;
    sVar5 = strlen(symbols + (ulong)uVar13 + 1);
    (baseName->super_SynBase).typeID = 4;
    (baseName->super_SynBase).begin = (Lexeme *)0x0;
    (baseName->super_SynBase).end = (Lexeme *)0x0;
    (baseName->super_SynBase).pos.begin = (char *)0x0;
    (baseName->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(baseName->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(baseName->super_SynBase).next + 2) = 0;
    (baseName->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
    (baseName->name).begin = symbols + (ulong)uVar13 + 1;
    (baseName->name).end = symbols + sVar5 + uVar13 + 1;
    pTVar6 = ExpressionContext::GetGenericAliasType(ctx,baseName);
    if ((moduleCtx->types).count <= i) goto LAB_0017493f;
    (moduleCtx->types).data[i] = &pTVar6->super_TypeBase;
    ppTVar10 = (moduleCtx->types).data;
    break;
  case CAT_ARRAY:
    pTVar8 = GetImportedModuleTypeAt(ctx,source,moduleCtx,(type->field_11).subType);
    if (pTVar8 == (TypeBase *)0x0) {
LAB_0017495e:
      uVar13 = type->offsetToName;
      uVar14 = *(int *)&(moduleCtx->data->name).end - (int)(moduleCtx->data->name).begin;
      pcVar12 = "ERROR: can\'t find sub type for \'%s\' in module %.*s";
LAB_001749d8:
      anon_unknown.dwarf_9fd58::Stop(ctx,source,pcVar12,symbols + uVar13,(ulong)uVar14);
    }
    if ((ulong)(type->field_8).arrSize == 0xffffffff) {
      pTVar11 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar8);
    }
    else {
      pTVar11 = (TypeUnsizedArray *)
                ExpressionContext::GetArrayType(ctx,pTVar8,(ulong)(type->field_8).arrSize);
    }
    if (((moduleCtx->types).count <= i) ||
       ((moduleCtx->types).data[i] = (TypeBase *)pTVar11, (moduleCtx->types).count <= i))
    goto LAB_0017493f;
    goto LAB_0017489e;
  case CAT_POINTER:
    pTVar8 = GetImportedModuleTypeAt(ctx,source,moduleCtx,(type->field_11).subType);
    if (pTVar8 == (TypeBase *)0x0) goto LAB_0017495e;
    pTVar7 = ExpressionContext::GetReferenceType(ctx,pTVar8);
    if ((moduleCtx->types).count <= i) goto LAB_0017493f;
LAB_00174865:
    (moduleCtx->types).data[i] = &pTVar7->super_TypeBase;
LAB_0017489e:
    pTVar8 = (moduleCtx->types).data[i];
    goto LAB_001748a9;
  case CAT_FUNCTION:
    local_38 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar4[(type->field_11).subType].type);
    if (local_38 == (TypeBase *)0x0) {
      uVar13 = type->offsetToName;
      uVar14 = *(int *)&(moduleCtx->data->name).end - (int)(moduleCtx->data->name).begin;
      pcVar12 = "ERROR: can\'t find return type for \'%s\' in module %.*s";
      goto LAB_001749d8;
    }
    local_48.head = (TypeHandle *)0x0;
    local_48.tail = (TypeHandle *)0x0;
    if ((type->field_8).arrSize != 0) {
      uVar13 = 1;
      do {
        pTVar8 = GetImportedModuleTypeAt
                           (ctx,source,moduleCtx,pEVar4[(type->field_11).subType + uVar13].type);
        if (pTVar8 == (TypeBase *)0x0) {
          pcVar12 = (moduleCtx->data->name).begin;
          anon_unknown.dwarf_9fd58::Stop
                    (ctx,source,"ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                     (ulong)uVar13,symbols + type->offsetToName,
                     (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar12),pcVar12);
        }
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        node = (TypeHandle *)CONCAT44(extraout_var_00,iVar2);
        node->type = pTVar8;
        node->next = (TypeHandle *)0x0;
        node->listed = false;
        IntrusiveList<TypeHandle>::push_back(&local_48,node);
        bVar15 = uVar13 < (type->field_8).arrSize;
        uVar13 = uVar13 + 1;
      } while (bVar15);
    }
    arguments_00.tail = local_48.tail;
    arguments_00.head = local_48.head;
    pTVar9 = ExpressionContext::GetFunctionType(ctx,source,local_38,arguments_00);
    if ((moduleCtx->types).count <= i) goto LAB_0017493f;
    (moduleCtx->types).data[i] = &pTVar9->super_TypeBase;
    ppTVar10 = (moduleCtx->types).data;
  }
  pTVar8 = ppTVar10[i];
LAB_001748a9:
  pTVar8->importModule = pMVar1;
  return;
}

Assistant:

void ImportSimpleModuleType(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, unsigned i)
{
	ModuleData *importModule = moduleCtx.data;

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);

	ExternTypeInfo &type = typeList[i];

	switch(type.subCat)
	{
	case ExternTypeInfo::CAT_NONE:
		if(strcmp(symbols + type.offsetToName, "generic") == 0)
		{
			// TODO: explicit category
			moduleCtx.types[i] = ctx.typeGeneric;

			moduleCtx.types[i]->importModule = importModule;
		}
		else if(*(symbols + type.offsetToName) == '@')
		{
			// TODO: explicit category
			moduleCtx.types[i] = ctx.GetGenericAliasType(new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr(symbols + type.offsetToName + 1)));

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, NULL))
			{
				moduleCtx.types[i] = prevType;
			}
			else
			{
				Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
			}
		}
		break;
	case ExternTypeInfo::CAT_ARRAY:
		if(TypeBase *subType = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.subType))
		{

			if(type.arrSize == ~0u)
				moduleCtx.types[i] = ctx.GetUnsizedArrayType(subType);
			else
				moduleCtx.types[i] = ctx.GetArrayType(subType, type.arrSize);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find sub type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	case ExternTypeInfo::CAT_POINTER:
		if(TypeBase *subType = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.subType))
		{
			moduleCtx.types[i] = ctx.GetReferenceType(subType);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find sub type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	case ExternTypeInfo::CAT_FUNCTION:
		if(TypeBase *returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberList[type.memberOffset].type))
		{
			IntrusiveList<TypeHandle> arguments;

			for(unsigned n = 0; n < type.memberCount; n++)
			{
				TypeBase *argType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberList[type.memberOffset + n + 1].type);

				if(!argType)
					Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
			}

			moduleCtx.types[i] = ctx.GetFunctionType(source, returnType, arguments);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find return type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	default:
		assert(!"unexpected type category");
	}
}